

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SrcListDelete(sqlite3 *db,SrcList *pList)

{
  int iVar1;
  anon_union_8_2_996c0f8d_for_u1 *paVar2;
  
  if (pList != (SrcList *)0x0) {
    if (0 < pList->nSrc) {
      paVar2 = &pList->a[0].u1;
      iVar1 = 0;
      do {
        if (paVar2[-0xb].zIndexedBy != (char *)0x0) {
          sqlite3DbFreeNN(db,paVar2[-0xb].zIndexedBy);
        }
        if (paVar2[-10].zIndexedBy != (char *)0x0) {
          sqlite3DbFreeNN(db,paVar2[-10].zIndexedBy);
        }
        if (paVar2[-9].zIndexedBy != (char *)0x0) {
          sqlite3DbFreeNN(db,paVar2[-9].zIndexedBy);
        }
        if ((((ulong)paVar2->zIndexedBy & 0x20000000000) != 0) &&
           (paVar2->zIndexedBy != (char *)0x0)) {
          sqlite3DbFreeNN(db,paVar2->zIndexedBy);
        }
        if ((((ulong)paVar2->zIndexedBy & 0x40000000000) != 0) &&
           (paVar2->pFuncArg != (ExprList *)0x0)) {
          exprListDeleteNN(db,paVar2->pFuncArg);
        }
        sqlite3DeleteTable(db,(Table *)paVar2[-8].pFuncArg);
        if ((Select *)paVar2[-7].pFuncArg != (Select *)0x0) {
          clearSelect(db,(Select *)paVar2[-7].pFuncArg,1);
        }
        if ((Expr *)paVar2[-3].pFuncArg != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,(Expr *)paVar2[-3].pFuncArg);
        }
        sqlite3IdListDelete(db,(IdList *)paVar2[-2].pFuncArg);
        iVar1 = iVar1 + 1;
        paVar2 = paVar2 + 0xe;
      } while (iVar1 < pList->nSrc);
    }
    sqlite3DbFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListDelete(sqlite3 *db, SrcList *pList){
  int i;
  struct SrcList_item *pItem;
  if( pList==0 ) return;
  for(pItem=pList->a, i=0; i<pList->nSrc; i++, pItem++){
    sqlite3DbFree(db, pItem->zDatabase);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zAlias);
    if( pItem->fg.isIndexedBy ) sqlite3DbFree(db, pItem->u1.zIndexedBy);
    if( pItem->fg.isTabFunc ) sqlite3ExprListDelete(db, pItem->u1.pFuncArg);
    sqlite3DeleteTable(db, pItem->pTab);
    sqlite3SelectDelete(db, pItem->pSelect);
    sqlite3ExprDelete(db, pItem->pOn);
    sqlite3IdListDelete(db, pItem->pUsing);
  }
  sqlite3DbFreeNN(db, pList);
}